

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

void __thiscall llbuild::basic::ProcessGroup::~ProcessGroup(ProcessGroup *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ProcessGroup *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex);
  while( true ) {
    bVar1 = std::
            unordered_map<int,_llbuild::basic::ProcessInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>_>
            ::empty(&this->processes);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::condition_variable::wait((unique_lock *)&this->processesCondition);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  std::condition_variable::~condition_variable(&this->processesCondition);
  std::
  unordered_map<int,_llbuild::basic::ProcessInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>_>
  ::~unordered_map(&this->processes);
  return;
}

Assistant:

ProcessGroup::~ProcessGroup() {
  // Wait for all processes in the process group to terminate
  std::unique_lock<std::mutex> lock(mutex);
  while (!processes.empty()) {
    processesCondition.wait(lock);
  }
}